

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void nni_msg_free(nni_msg *m)

{
  int iVar1;
  nni_msg *m_local;
  
  if (m != (nni_msg *)0x0) {
    iVar1 = nni_atomic_dec_nv(&m->m_refcnt);
    if (iVar1 == 0) {
      nni_chunk_free(&m->m_body);
      nni_free(m,0xf8);
    }
  }
  return;
}

Assistant:

void
nni_msg_free(nni_msg *m)
{
	if ((m != NULL) && (nni_atomic_dec_nv(&m->m_refcnt) == 0)) {
		nni_chunk_free(&m->m_body);
		NNI_FREE_STRUCT(m);
	}
}